

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restore.c
# Opt level: O3

void * decrypt_thread(void *pargs)

{
  long lVar1;
  ssize_t sVar2;
  size_t length;
  long lVar3;
  ulong uVar4;
  sha256_context *psVar5;
  sha256_context *psVar6;
  long lVar7;
  size_t ilen;
  byte bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  uint8_t hash [32];
  uint8_t iv [16];
  uint8_t next_iv [16];
  sha256_context ctx;
  sha256_context tmp;
  aes_context aes;
  uint8_t buffer [32800];
  uchar local_8288;
  char cStack_8287;
  char cStack_8286;
  char cStack_8285;
  char cStack_8284;
  char cStack_8283;
  char cStack_8282;
  char cStack_8281;
  char cStack_8280;
  char cStack_827f;
  char cStack_827e;
  char cStack_827d;
  char cStack_827c;
  char cStack_827b;
  char cStack_827a;
  char cStack_8279;
  char local_8278;
  char cStack_8277;
  char cStack_8276;
  char cStack_8275;
  char cStack_8274;
  char cStack_8273;
  char cStack_8272;
  char cStack_8271;
  char cStack_8270;
  char cStack_826f;
  char cStack_826e;
  char cStack_826d;
  char cStack_826c;
  char cStack_826b;
  char cStack_826a;
  char cStack_8269;
  undefined8 local_8268;
  undefined8 uStack_8260;
  undefined8 local_8258;
  undefined8 uStack_8250;
  sha256_context local_8248;
  sha256_context local_81e0;
  aes_context local_8178;
  int local_8058 [8192];
  uchar local_58;
  char cStack_57;
  char cStack_56;
  char cStack_55;
  char cStack_54;
  char cStack_53;
  char cStack_52;
  char cStack_51;
  char cStack_50;
  char cStack_4f;
  char cStack_4e;
  char cStack_4d;
  char cStack_4c;
  char cStack_4b;
  char cStack_4a;
  char cStack_49;
  char local_48;
  char cStack_47;
  char cStack_46;
  char cStack_45;
  char cStack_44;
  char cStack_43;
  char cStack_42;
  char cStack_41;
  char cStack_40;
  char cStack_3f;
  char cStack_3e;
  char cStack_3d;
  char cStack_3c;
  char cStack_3b;
  char cStack_3a;
  char cStack_39;
  
  bVar8 = 0;
  lVar7 = 0x10;
  sVar2 = read_block(*pargs,&local_8268,0x10);
  if (sVar2 < 0x10) {
    decrypt_thread_cold_3();
  }
  else {
    aes_init_dec(&local_8178,(uint8_t *)((long)pargs + 8),0x100);
    sha256_init(&local_8248);
    sha256_starts(&local_8248);
    length = read_block(*pargs,local_8058,0x8020);
    if (0 < (long)length) {
      lVar7 = 0x10;
      do {
        local_8258 = *(undefined8 *)((long)local_8058 + (length - 0x10));
        uStack_8250 = *(undefined8 *)((long)local_8058 + (length - 8));
        aes_cbc_decrypt(&local_8178,(uint8_t *)&local_8268,(uint8_t *)local_8058,length,
                        (uint8_t *)local_8058);
        if (length != 0x8020) {
          lVar3 = length - 0x10;
          lVar7 = lVar7 + length;
          goto LAB_001028a9;
        }
        sha256_update(&local_8248,(uchar *)local_8058,0x8000);
        sha256_copy(&local_81e0,&local_8248);
        sha256_final(&local_81e0,&local_8288);
        auVar11[0] = -(local_48 == local_8278);
        auVar11[1] = -(cStack_47 == cStack_8277);
        auVar11[2] = -(cStack_46 == cStack_8276);
        auVar11[3] = -(cStack_45 == cStack_8275);
        auVar11[4] = -(cStack_44 == cStack_8274);
        auVar11[5] = -(cStack_43 == cStack_8273);
        auVar11[6] = -(cStack_42 == cStack_8272);
        auVar11[7] = -(cStack_41 == cStack_8271);
        auVar11[8] = -(cStack_40 == cStack_8270);
        auVar11[9] = -(cStack_3f == cStack_826f);
        auVar11[10] = -(cStack_3e == cStack_826e);
        auVar11[0xb] = -(cStack_3d == cStack_826d);
        auVar11[0xc] = -(cStack_3c == cStack_826c);
        auVar11[0xd] = -(cStack_3b == cStack_826b);
        auVar11[0xe] = -(cStack_3a == cStack_826a);
        auVar11[0xf] = -(cStack_39 == cStack_8269);
        auVar9[0] = -(local_58 == local_8288);
        auVar9[1] = -(cStack_57 == cStack_8287);
        auVar9[2] = -(cStack_56 == cStack_8286);
        auVar9[3] = -(cStack_55 == cStack_8285);
        auVar9[4] = -(cStack_54 == cStack_8284);
        auVar9[5] = -(cStack_53 == cStack_8283);
        auVar9[6] = -(cStack_52 == cStack_8282);
        auVar9[7] = -(cStack_51 == cStack_8281);
        auVar9[8] = -(cStack_50 == cStack_8280);
        auVar9[9] = -(cStack_4f == cStack_827f);
        auVar9[10] = -(cStack_4e == cStack_827e);
        auVar9[0xb] = -(cStack_4d == cStack_827d);
        auVar9[0xc] = -(cStack_4c == cStack_827c);
        auVar9[0xd] = -(cStack_4b == cStack_827b);
        auVar9[0xe] = -(cStack_4a == cStack_827a);
        auVar9[0xf] = -(cStack_49 == cStack_8279);
        auVar9 = auVar9 & auVar11;
        if ((ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar9[0xf] >> 7) << 0xf) != 0xffff) {
          decrypt_thread_cold_1();
          goto LAB_00102961;
        }
        write_block(*(int *)((long)pargs + 4),local_8058,0x8000);
        local_8268 = local_8258;
        uStack_8260 = uStack_8250;
        lVar7 = lVar7 + 0x8020;
        length = read_block(*pargs,local_8058,0x8020);
      } while (0 < (long)length);
    }
    if ((long)length < 0) {
      decrypt_thread_cold_2();
    }
    else {
      lVar3 = -0x10;
      length = 0;
LAB_001028a9:
      lVar1 = *(long *)((long)local_8058 + (length - 8));
      if (lVar1 == lVar7) {
        if (*(int *)((long)local_8058 + lVar3) + 0x30 <= length) {
          uVar4 = (ulong)(*(int *)((long)local_8058 + lVar3) + 0x10);
          ilen = (length - 0x20) - uVar4;
          sha256_update(&local_8248,(uchar *)local_8058,ilen);
          psVar5 = &local_8248;
          psVar6 = &local_81e0;
          for (lVar3 = 0x1a; lVar3 != 0; lVar3 = lVar3 + -1) {
            psVar6->total[0] = psVar5->total[0];
            psVar5 = (sha256_context *)((long)psVar5 + (ulong)bVar8 * -8 + 4);
            psVar6 = (sha256_context *)((long)psVar6 + (ulong)bVar8 * -8 + 4);
          }
          sha256_final(&local_81e0,&local_8288);
          auVar12[0] = -(*(char *)((long)local_8058 + ilen + 0x10) == local_8278);
          auVar12[1] = -(*(char *)((long)local_8058 + ilen + 0x11) == cStack_8277);
          auVar12[2] = -(*(char *)((long)local_8058 + ilen + 0x12) == cStack_8276);
          auVar12[3] = -(*(char *)((long)local_8058 + ilen + 0x13) == cStack_8275);
          auVar12[4] = -(*(char *)((long)local_8058 + ilen + 0x14) == cStack_8274);
          auVar12[5] = -(*(char *)((long)local_8058 + ilen + 0x15) == cStack_8273);
          auVar12[6] = -(*(char *)((long)local_8058 + ilen + 0x16) == cStack_8272);
          auVar12[7] = -(*(char *)((long)local_8058 + ilen + 0x17) == cStack_8271);
          auVar12[8] = -(*(char *)((long)local_8058 + ilen + 0x18) == cStack_8270);
          auVar12[9] = -(*(char *)((long)local_8058 + ilen + 0x19) == cStack_826f);
          auVar12[10] = -(*(char *)((long)local_8058 + ilen + 0x1a) == cStack_826e);
          auVar12[0xb] = -(*(char *)((long)local_8058 + ilen + 0x1b) == cStack_826d);
          auVar12[0xc] = -(*(char *)((long)local_8058 + ilen + 0x1c) == cStack_826c);
          auVar12[0xd] = -(*(char *)((long)local_8058 + ilen + 0x1d) == cStack_826b);
          auVar12[0xe] = -(*(char *)((long)local_8058 + ilen + 0x1e) == cStack_826a);
          auVar12[0xf] = -(*(char *)((long)local_8058 + ilen + 0x1f) == cStack_8269);
          auVar10[0] = -(*(uchar *)((long)local_8058 + ilen) == local_8288);
          auVar10[1] = -(*(char *)((long)local_8058 + ilen + 1) == cStack_8287);
          auVar10[2] = -(*(char *)((long)local_8058 + ilen + 2) == cStack_8286);
          auVar10[3] = -(*(char *)((long)local_8058 + ilen + 3) == cStack_8285);
          auVar10[4] = -(*(char *)((long)local_8058 + ilen + 4) == cStack_8284);
          auVar10[5] = -(*(char *)((long)local_8058 + ilen + 5) == cStack_8283);
          auVar10[6] = -(*(char *)((long)local_8058 + ilen + 6) == cStack_8282);
          auVar10[7] = -(*(char *)((long)local_8058 + ilen + 7) == cStack_8281);
          auVar10[8] = -(*(char *)((long)local_8058 + ilen + 8) == cStack_8280);
          auVar10[9] = -(*(char *)((long)local_8058 + ilen + 9) == cStack_827f);
          auVar10[10] = -(*(char *)((long)local_8058 + ilen + 10) == cStack_827e);
          auVar10[0xb] = -(*(char *)((long)local_8058 + ilen + 0xb) == cStack_827d);
          auVar10[0xc] = -(*(char *)((long)local_8058 + ilen + 0xc) == cStack_827c);
          auVar10[0xd] = -(*(char *)((long)local_8058 + ilen + 0xd) == cStack_827b);
          auVar10[0xe] = -(*(char *)((long)local_8058 + ilen + 0xe) == cStack_827a);
          auVar10[0xf] = -(*(char *)((long)local_8058 + ilen + 0xf) == cStack_8279);
          auVar10 = auVar10 & auVar12;
          if ((ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar10[0xf] >> 7) << 0xf) == 0xffff) {
            write_block(*(int *)((long)pargs + 4),local_8058,ilen);
          }
          else {
            fprintf(_stderr,"hash mismatch at offset 0x%lx (final block), (buffer size 0x%zx)\n",
                    (lVar7 + (length - 0x20)) - uVar4,length);
            print_hash("expected",(uint8_t *)((long)local_8058 + (length - 0x20)));
            print_hash("actual",&local_8288);
          }
        }
      }
      else {
        fprintf(_stderr,"read size mismatch. expected: 0x%llx, actual: 0x%zx\n",lVar1,lVar7);
      }
    }
  }
LAB_00102961:
  close(*(int *)((long)pargs + 4));
  close(*pargs);
  return (void *)0x0;
}

Assistant:

void *decrypt_thread(void *pargs) {
  args_t *args = (args_t *)pargs;
  sha256_context ctx, tmp;
  aes_context aes;
  uint8_t iv[AES_BLOCK_SIZE];
  uint8_t next_iv[AES_BLOCK_SIZE];
  uint8_t hash[SHA256_BLOCK_SIZE];
  uint8_t buffer[PSVIMG_BLOCK_SIZE + SHA256_BLOCK_SIZE];
  ssize_t rd, total;

  // read iv
  if (read_block(args->in, iv, AES_BLOCK_SIZE) < AES_BLOCK_SIZE) {
    fprintf(stderr, "file too small! cannot read IV!\n");
    goto end;
  }

  // decrypt blocks
  aes_init_dec(&aes, args->key, 256);
  sha256_init(&ctx);
  sha256_starts(&ctx);
  total = AES_BLOCK_SIZE;
  while ((rd = read_block(args->in, buffer, sizeof(buffer))) > 0) {
    // save next iv
    memcpy(next_iv, &buffer[rd - AES_BLOCK_SIZE], AES_BLOCK_SIZE);

    // decrypt
    aes_cbc_decrypt(&aes, iv, buffer, rd, buffer);

    if (rd != sizeof(buffer)) {
      total += rd;
      break; // last block requires special processing
    }

    // TODO: there's actually a bug in Sony's implementation where 
    // if the last block is exactly 0x8000 (before the SHA256) then 
    // it won't know about the last block and terminate in error. 
    // In other words, we don't have to handle this edge case... for now.

    // validate hash
    sha256_update(&ctx, buffer, rd - SHA256_BLOCK_SIZE);
    sha256_copy(&tmp, &ctx);
    sha256_final(&tmp, hash);
    if (memcmp(&buffer[rd-SHA256_BLOCK_SIZE], hash, SHA256_BLOCK_SIZE) != 0) {
      fprintf(stderr, "hash mismatch at offset 0x%zx, (buffer size 0x%zx)\n", total + rd - SHA256_BLOCK_SIZE, rd);
      print_hash("expected", &buffer[rd-SHA256_BLOCK_SIZE]);
      print_hash("actual", hash);
      goto end;
    }

    // write output
    write_block(args->out, buffer, rd - SHA256_BLOCK_SIZE);

    memcpy(iv, next_iv, AES_BLOCK_SIZE);
    total += rd;
  }

  if (rd < 0) {
    fprintf(stderr, "Read error occured!\n");
    goto end;
  }

  // handle last block specially
  uint64_t exp_total;
  uint32_t exp_padding;

  exp_padding = le32toh(*(uint32_t *)&buffer[rd-0x10]);
  exp_total = le64toh(*(uint64_t *)&buffer[rd-0x8]);
  if (exp_total != total) {
    fprintf(stderr, "read size mismatch. expected: 0x%llx, actual: 0x%zx\n", exp_total, total);
    goto end;
  }
  exp_padding += 0x10;
  if (rd >= SHA256_BLOCK_SIZE + exp_padding) {
    sha256_update(&ctx, buffer, rd - SHA256_BLOCK_SIZE - exp_padding);
    tmp = ctx;
    sha256_final(&tmp, hash);
    if (memcmp(&buffer[rd-SHA256_BLOCK_SIZE-exp_padding], hash, SHA256_BLOCK_SIZE) != 0) {
      fprintf(stderr, "hash mismatch at offset 0x%lx (final block), (buffer size 0x%zx)\n", total + rd - SHA256_BLOCK_SIZE - exp_padding, rd);
      print_hash("expected", &buffer[rd-SHA256_BLOCK_SIZE]);
      print_hash("actual", hash);
      goto end;
    }
    write_block(args->out, buffer, rd - SHA256_BLOCK_SIZE - exp_padding);
  }

end:
  close(args->out);
  close(args->in);
  return NULL;
}